

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O3

URI * __thiscall HN::getItemURI_abi_cxx11_(URI *__return_storage_ptr__,HN *this,ItemId id)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  uint __val;
  uint uVar8;
  string __str;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar8 = (uint)this;
  __val = -uVar8;
  if (0 < (int)uVar8) {
    __val = uVar8;
  }
  uVar8 = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar2 = 4;
    do {
      uVar8 = uVar2;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_0010b36f;
      }
      if (uVar4 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_0010b36f;
      }
      if (uVar4 < 10000) goto LAB_0010b36f;
      uVar7 = uVar7 / 10000;
      uVar2 = uVar8 + 4;
    } while (99999 < uVar4);
    uVar8 = uVar8 + 1;
  }
LAB_0010b36f:
  uVar7 = (ulong)this >> 0x1f & 1;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar8 + (char)uVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)(uVar7 + (long)local_50[0]),uVar8,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,kAPIItem_abi_cxx11_);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

URI getItemURI(ItemId id) {
        return kAPIItem + std::to_string(id) + ".json";
    }